

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O2

ZSTD_CCtx * ZSTD_initStaticCCtx(void *workspace,size_t workspaceSize)

{
  ZSTD_CCtx *__s;
  ZSTD_compressedBlockState_t *pZVar1;
  U32 *pUVar2;
  ZSTD_cwksp *ws;
  ZSTD_cpuid_t ZVar3;
  ZSTD_cwksp local_50;
  
  if (((ulong)workspace & 7) == 0 && 0x488 < workspaceSize) {
    ZSTD_cwksp_init(&local_50,workspace,workspaceSize);
    __s = (ZSTD_CCtx *)ZSTD_cwksp_reserve_object(&local_50,0x488);
    if (__s != (ZSTD_CCtx *)0x0) {
      memset(__s,0,0x488);
      (__s->workspace).tableValidEnd = local_50.tableValidEnd;
      (__s->workspace).allocStart = local_50.allocStart;
      (__s->workspace).allocFailed = local_50.allocFailed;
      (__s->workspace).workspaceOversizedDuration = local_50.workspaceOversizedDuration;
      (__s->workspace).phase = local_50.phase;
      *(undefined4 *)&(__s->workspace).field_0x3c = local_50._60_4_;
      (__s->workspace).workspace = local_50.workspace;
      (__s->workspace).workspaceEnd = local_50.workspaceEnd;
      (__s->workspace).objectEnd = local_50.objectEnd;
      (__s->workspace).tableEnd = local_50.tableEnd;
      __s->staticSize = workspaceSize;
      if (0x3bdf < (ulong)((long)(__s->workspace).allocStart - (long)(__s->workspace).tableEnd)) {
        ws = &__s->workspace;
        pZVar1 = (ZSTD_compressedBlockState_t *)ZSTD_cwksp_reserve_object(ws,0x11f0);
        (__s->blockState).prevCBlock = pZVar1;
        pZVar1 = (ZSTD_compressedBlockState_t *)ZSTD_cwksp_reserve_object(ws,0x11f0);
        (__s->blockState).nextCBlock = pZVar1;
        pUVar2 = (U32 *)ZSTD_cwksp_reserve_object(ws,0x1800);
        __s->entropyWorkspace = pUVar2;
        ZVar3 = ZSTD_cpuid();
        __s->bmi2 = ZVar3.f1c >> 8 & 1;
        return __s;
      }
    }
  }
  return (ZSTD_CCtx *)0x0;
}

Assistant:

ZSTD_CCtx* ZSTD_initStaticCCtx(void *workspace, size_t workspaceSize)
{
    ZSTD_cwksp ws;
    ZSTD_CCtx* cctx;
    if (workspaceSize <= sizeof(ZSTD_CCtx)) return NULL;  /* minimum size */
    if ((size_t)workspace & 7) return NULL;  /* must be 8-aligned */
    ZSTD_cwksp_init(&ws, workspace, workspaceSize);

    cctx = (ZSTD_CCtx*)ZSTD_cwksp_reserve_object(&ws, sizeof(ZSTD_CCtx));
    if (cctx == NULL) {
        return NULL;
    }
    memset(cctx, 0, sizeof(ZSTD_CCtx));
    ZSTD_cwksp_move(&cctx->workspace, &ws);
    cctx->staticSize = workspaceSize;

    /* statically sized space. entropyWorkspace never moves (but prev/next block swap places) */
    if (!ZSTD_cwksp_check_available(&cctx->workspace, HUF_WORKSPACE_SIZE + 2 * sizeof(ZSTD_compressedBlockState_t))) return NULL;
    cctx->blockState.prevCBlock = (ZSTD_compressedBlockState_t*)ZSTD_cwksp_reserve_object(&cctx->workspace, sizeof(ZSTD_compressedBlockState_t));
    cctx->blockState.nextCBlock = (ZSTD_compressedBlockState_t*)ZSTD_cwksp_reserve_object(&cctx->workspace, sizeof(ZSTD_compressedBlockState_t));
    cctx->entropyWorkspace = (U32*)ZSTD_cwksp_reserve_object(
        &cctx->workspace, HUF_WORKSPACE_SIZE);
    cctx->bmi2 = ZSTD_cpuid_bmi2(ZSTD_cpuid());
    return cctx;
}